

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

shared_ptr<fasttext::Matrix> __thiscall
fasttext::FastText::getInputMatrixFromFile(FastText *this,string *filename)

{
  pointer pcVar1;
  _Hash_node_base *p_Var2;
  size_type sVar3;
  long lVar4;
  pointer pfVar5;
  undefined8 uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  FastText *pFVar7;
  char cVar8;
  int32_t iVar9;
  uint uVar10;
  istream *piVar11;
  invalid_argument *piVar12;
  long *plVar13;
  size_type *psVar14;
  DenseMatrix *pDVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer pfVar16;
  long lVar17;
  EVP_PKEY_CTX *ctx;
  ulong uVar18;
  shared_ptr<fasttext::Matrix> sVar19;
  int64_t dim;
  string word;
  int64_t n;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  ifstream in;
  ulong local_340;
  undefined1 local_338 [40];
  pointer local_310;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_308;
  string *local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  FastText *local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string local_298;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  istream local_238 [520];
  
  local_2e0 = this;
  std::ifstream::ifstream(local_238,(string *)in_RDX,_S_in);
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar8 = std::__basic_file<char>::is_open();
  if (cVar8 == '\0') {
    piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                   in_RDX," cannot be opened for loading!");
    std::invalid_argument::invalid_argument(piVar12,(string *)local_338);
    __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar11 = std::istream::_M_extract<long>((long *)local_238);
  std::istream::_M_extract<long>((long *)piVar11);
  local_300 = filename;
  if (local_340 == (long)*(int *)((filename->_M_dataplus)._M_p + 0x84)) {
    local_338._0_8_ = (DenseMatrix *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<fasttext::DenseMatrix,std::allocator<fasttext::DenseMatrix>,long&,long&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_338 + 8),
               (DenseMatrix **)local_338,(allocator<fasttext::DenseMatrix> *)&local_2b8,
               (long *)&local_310,(long *)&local_340);
    uVar6 = local_338._0_8_;
    local_308 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_;
    if (local_310 != (pointer)0x0) {
      pfVar16 = (pointer)0x0;
      do {
        local_338._0_8_ = local_338 + 0x10;
        local_338._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_338._16_8_ = local_338._16_8_ & 0xffffffffffffff00;
        std::operator>>(local_238,(string *)local_338);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_2f8,(value_type *)local_338);
        Dictionary::add((Dictionary *)(filename->field_2)._M_allocated_capacity,
                        (value_type *)local_338);
        if (local_340 != 0) {
          uVar18 = 0;
          do {
            std::istream::_M_extract<float>((float *)local_238);
            uVar18 = uVar18 + 1;
          } while (uVar18 < local_340);
        }
        if ((DenseMatrix *)local_338._0_8_ != (DenseMatrix *)(local_338 + 0x10)) {
          operator_delete((void *)local_338._0_8_);
        }
        pfVar16 = (pointer)((long)pfVar16 + 1);
        filename = local_300;
      } while (pfVar16 < local_310);
    }
    this_00 = local_308;
    std::ifstream::close();
    ctx = (EVP_PKEY_CTX *)0x1;
    Dictionary::threshold((Dictionary *)(filename->field_2)._M_allocated_capacity,1,0);
    Dictionary::init((Dictionary *)(filename->field_2)._M_allocated_capacity,ctx);
    iVar9 = Dictionary::nwords((Dictionary *)(filename->field_2)._M_allocated_capacity);
    pcVar1 = (filename->_M_dataplus)._M_p;
    local_2b8._M_dataplus._M_p._0_4_ = iVar9 + *(int *)(pcVar1 + 0xa8);
    local_338._0_8_ = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<fasttext::DenseMatrix,std::allocator<fasttext::DenseMatrix>,int,int&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_338 + 8),
               (DenseMatrix **)local_338,(allocator<fasttext::DenseMatrix> *)&local_2d8,
               (int *)&local_2b8,(int *)(pcVar1 + 0x84));
    pcVar1 = (filename->_M_dataplus)._M_p;
    DenseMatrix::uniform
              ((DenseMatrix *)local_338._0_8_,1.0 / (float)*(int *)(pcVar1 + 0x84),
               *(uint *)(pcVar1 + 0xb4),*(int32_t *)(pcVar1 + 0x10c));
    if (local_310 != (pointer)0x0) {
      lVar17 = 0;
      pfVar16 = (pointer)0x0;
      do {
        uVar10 = Dictionary::getId((Dictionary *)(filename->field_2)._M_allocated_capacity,
                                   local_2f8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + (long)pfVar16);
        if (-1 < (int)uVar10) {
          iVar9 = Dictionary::nwords((Dictionary *)(filename->field_2)._M_allocated_capacity);
          if (((int)uVar10 < iVar9) && (local_340 != 0)) {
            p_Var2 = ((__node_base *)(local_338._0_8_ + 0x10))->_M_nxt;
            sVar3 = *(size_type *)(local_338._0_8_ + 0x18);
            lVar4 = *(int64_t *)(uVar6 + 0x10);
            pfVar5 = (((vector<float,_std::allocator<float>_> *)(uVar6 + 0x18))->
                     super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar18 = 0;
            do {
              *(undefined4 *)((ulong)uVar10 * (long)p_Var2 * 4 + sVar3 + uVar18 * 4) =
                   *(undefined4 *)((long)pfVar5 + uVar18 * 4 + lVar4 * lVar17);
              uVar18 = uVar18 + 1;
            } while (local_340 != uVar18);
          }
        }
        pfVar16 = (pointer)((long)pfVar16 + 1);
        lVar17 = lVar17 + 4;
      } while (pfVar16 < local_310);
    }
    pFVar7 = local_2e0;
    (local_2e0->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_338._0_8_;
    (local_2e0->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2f8);
    std::ifstream::~ifstream(local_238);
    sVar19.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar19.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pFVar7;
    return (shared_ptr<fasttext::Matrix>)
           sVar19.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>;
  }
  piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_298,local_340);
  std::operator+(&local_258,"Dimension of pretrained vectors (",&local_298);
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_2d8._M_dataplus._M_p = (pointer)*plVar13;
  psVar14 = (size_type *)(plVar13 + 2);
  if ((size_type *)local_2d8._M_dataplus._M_p == psVar14) {
    local_2d8.field_2._M_allocated_capacity = *psVar14;
    local_2d8.field_2._8_8_ = plVar13[3];
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  }
  else {
    local_2d8.field_2._M_allocated_capacity = *psVar14;
  }
  local_2d8._M_string_length = plVar13[1];
  *plVar13 = (long)psVar14;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  std::__cxx11::to_string(&local_278,*(int *)((local_300->_M_dataplus)._M_p + 0x84));
  std::operator+(&local_2b8,&local_2d8,&local_278);
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  local_338._0_8_ = *plVar13;
  pDVar15 = (DenseMatrix *)(plVar13 + 2);
  if ((DenseMatrix *)local_338._0_8_ == pDVar15) {
    local_338._16_8_ = (pDVar15->super_Matrix)._vptr_Matrix;
    local_338._24_8_ = plVar13[3];
    local_338._0_8_ = (DenseMatrix *)(local_338 + 0x10);
  }
  else {
    local_338._16_8_ = (pDVar15->super_Matrix)._vptr_Matrix;
  }
  local_338._8_8_ = plVar13[1];
  *plVar13 = (long)pDVar15;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  std::invalid_argument::invalid_argument(piVar12,(string *)local_338);
  __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::shared_ptr<Matrix> FastText::getInputMatrixFromFile(
    const std::string& filename) const {
  std::ifstream in(filename);
  std::vector<std::string> words;
  std::shared_ptr<DenseMatrix> mat; // temp. matrix for pretrained vectors
  int64_t n, dim;
  if (!in.is_open()) {
    throw std::invalid_argument(filename + " cannot be opened for loading!");
  }
  in >> n >> dim;
  if (dim != args_->dim) {
    throw std::invalid_argument(
        "Dimension of pretrained vectors (" + std::to_string(dim) +
        ") does not match dimension (" + std::to_string(args_->dim) + ")!");
  }
  mat = std::make_shared<DenseMatrix>(n, dim);
  for (size_t i = 0; i < n; i++) {
    std::string word;
    in >> word;
    words.push_back(word);
    dict_->add(word);
    for (size_t j = 0; j < dim; j++) {
      in >> mat->at(i, j);
    }
  }
  in.close();

  dict_->threshold(1, 0);
  dict_->init();
  std::shared_ptr<DenseMatrix> input = std::make_shared<DenseMatrix>(
      dict_->nwords() + args_->bucket, args_->dim);
  input->uniform(1.0 / args_->dim, args_->thread, args_->seed);

  for (size_t i = 0; i < n; i++) {
    int32_t idx = dict_->getId(words[i]);
    if (idx < 0 || idx >= dict_->nwords()) {
      continue;
    }
    for (size_t j = 0; j < dim; j++) {
      input->at(idx, j) = mat->at(i, j);
    }
  }
  return input;
}